

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::x86::EmitHelper::emitRegMove
          (EmitHelper *this,Operand_ *dst_,Operand_ *src_,TypeId typeId,char *comment)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  BaseEmitter *pBVar4;
  byte bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  TypeId TVar8;
  byte bVar9;
  Error EVar10;
  uint uVar11;
  Signature SVar12;
  InstId IVar13;
  uint32_t uVar14;
  undefined7 in_register_00000009;
  uint *puVar15;
  InstId IVar16;
  ulong extraout_RDX;
  ulong uVar17;
  uint uVar18;
  uint size;
  uint uVar19;
  uint uVar20;
  int iVar21;
  ArchTraits *this_00;
  ulong uVar22;
  char *in_R9;
  byte bVar23;
  bool bVar24;
  Operand_ OStack_a0;
  Operand_ OStack_90;
  Operand dst;
  Operand src;
  
  puVar15 = (uint *)CONCAT71(in_register_00000009,typeId);
  if ((0xba < (byte)(typeId + ~_kVec512End)) && ((typeId & 0x7e) != _kBaseStart)) {
    dst.super_Operand_._signature._bits = (dst_->_signature)._bits;
    dst.super_Operand_._baseId = dst_->_baseId;
    dst.super_Operand_._data = *&dst_->_data;
    uVar6._0_4_ = (src_->_signature)._bits;
    uVar6._4_4_ = src_->_baseId;
    src.super_Operand_._data = *&src_->_data;
    bVar23 = (dst.super_Operand_._signature._bits & 7) == 2;
    src.super_Operand_._0_8_ = uVar6;
    if ((bool)bVar23) {
      BaseMem::setSize((BaseMem *)&dst,uVar6._0_4_ >> 0x18);
    }
    if ((uVar6._0_4_ & 7) == 2) {
      bVar23 = bVar23 | 2;
      BaseMem::setSize((BaseMem *)&src,(uint)dst.super_Operand_._signature._bits._3_1_);
    }
    IVar13 = 0x1a2;
    switch(typeId) {
    case kInt8:
    case kUInt8:
    case kInt16:
    case kUInt16:
      if ((bVar23 & 2) == 0) {
        if (bVar23 == 0) {
          dst.super_Operand_._signature._bits = 0x4000031;
          src.super_Operand_._signature._bits = 0x4000031;
        }
      }
      else {
        dst.super_Operand_._signature._bits = 0x4000031;
        IVar13 = 0x1c9;
      }
      break;
    case kInt32:
    case kUInt32:
    case kInt64:
    case _kIntEnd:
      break;
    default:
      cVar1 = TypeUtils::_typeData[typeId];
      if (bVar23 == 0 || 9 < (byte)(typeId - _kVec32Start)) {
        if (9 < (byte)(typeId - _kVec64Start) || bVar23 == 0) {
          if (cVar1 == '+') {
            bVar24 = this->_avxEnabled == false;
            IVar16 = 0x481;
            IVar13 = 0x1a4;
          }
          else if (cVar1 == '*') {
            bVar24 = this->_avxEnabled == false;
            IVar16 = 0x482;
            IVar13 = 0x1a5;
          }
          else {
            IVar13 = 0x486;
            if (this->_avx512Enabled != false) break;
            bVar24 = this->_avxEnabled == false;
            IVar16 = 0x485;
            IVar13 = 0x1ac;
          }
          if (!bVar24) {
            IVar13 = IVar16;
          }
          break;
        }
        bVar24 = (this->_avxEnabled & 1U) != 0;
        IVar16 = 0x1c1;
        if (bVar24) {
          IVar16 = 0x49a;
        }
        IVar13 = 0x1be;
        if (bVar24) {
          IVar13 = 0x499;
        }
        if (cVar1 == '+') {
          IVar13 = IVar16;
        }
        uVar14 = 8;
      }
      else {
        bVar24 = (this->_avxEnabled & 1U) != 0;
        IVar16 = 0x1c4;
        if (bVar24) {
          IVar16 = 0x49e;
        }
        IVar13 = 0x1a7;
        if (bVar24) {
          IVar13 = 0x483;
        }
        if (cVar1 == '*') {
          IVar13 = IVar16;
        }
        uVar14 = 4;
      }
      if ((dst.super_Operand_._signature._bits & 7) == 2) {
        BaseMem::setSize((BaseMem *)&dst,uVar14);
      }
      if ((src.super_Operand_._signature._bits & 7) == 2) {
        BaseMem::setSize((BaseMem *)&src,uVar14);
      }
      break;
    case _kMaskStart:
      IVar13 = 0x150;
      break;
    case kMask16:
      IVar13 = 0x153;
      break;
    case kMask32:
      IVar13 = 0x151;
      break;
    case _kMaskEnd:
      IVar13 = 0x152;
      break;
    case _kMmxStart:
      IVar13 = 0x1a7;
      if (bVar23 != 0) break;
    case _kMmxEnd:
      IVar13 = 0x1be;
    }
    pBVar4 = (this->super_BaseEmitHelper)._emitter;
    pBVar4->_inlineComment = comment;
    EVar10 = BaseEmitter::_emitI(pBVar4,IVar13,&dst.super_Operand_,&src.super_Operand_);
    return EVar10;
  }
  emitRegMove();
  bVar23 = (byte)comment;
  uVar17 = extraout_RDX;
  this_00 = (ArchTraits *)this;
  if ((int)extraout_RDX == 0) {
    this_00 = (ArchTraits *)
              (_archTraits +
              (ulong)((*(BaseEmitter **)&((ArchTraits *)this)->_minStackOffset)->_environment)._arch
              * 0xd8);
    TVar8 = ArchTraits::regTypeToTypeId(this_00,(byte)(dst_->_signature)._bits >> 3);
    uVar17 = (ulong)TVar8;
  }
  iVar21 = (int)this_00;
  bVar5 = (byte)uVar17;
  if ((0x44 < (byte)(bVar5 - 0x20)) || ((bVar5 & 0x7e) == 0x20)) {
    emitArgMove();
LAB_00140247:
    emitArgMove();
    EVar10 = 0;
    if (iVar21 - 1U < 8) {
      EVar10 = *(Error *)(&DAT_00153d48 + (ulong)(iVar21 - 1U) * 4);
    }
    return EVar10;
  }
  bVar9 = bVar23 - 0x20;
  if ((0x44 < bVar9) || ((bVar23 & 0x7e) == 0x20)) goto LAB_00140247;
  OStack_90._signature._bits = (dst_->_signature)._bits;
  OStack_90._baseId = dst_->_baseId;
  OStack_90._data = *&dst_->_data;
  uVar7._0_4_ = puVar15[0];
  uVar7._4_4_ = puVar15[1];
  OStack_a0._data = *(uint32_t (*) [2])(puVar15 + 2);
  uVar17 = uVar17 & 0xff;
  bVar2 = TypeUtils::_typeData[uVar17 + 0x100];
  uVar22 = (ulong)comment & 0xff;
  bVar3 = TypeUtils::_typeData[uVar22 + 0x100];
  uVar18 = (uint)bVar3;
  uVar19 = (uint)bVar2;
  uVar11 = (uint)bVar3;
  OStack_a0._0_8_ = uVar7;
  if ((byte)(bVar5 - 0x20) < 10) {
    if (bVar9 < 10) {
      uVar20 = (int)uVar17 << 8 | (uint)uVar22;
      IVar13 = 0x1c5;
      size = (uint)bVar3;
      if (((uVar20 == 0x2422) || (size = uVar11, uVar20 == 0x2622)) ||
         ((uVar20 == 0x2624 || ((uVar20 == 0x2822 || (uVar20 == 0x2824)))))) goto LAB_0014003c;
      if (uVar20 == 0x2826) {
        IVar13 = 0x1c6;
        goto LAB_0014003c;
      }
    }
    else if ((*puVar15 & 7) != 2) {
      size = (uint)bVar3;
      if (uVar19 < uVar11) {
        size = (uint)bVar2;
      }
      if ((byte)(bVar23 - 0x31) < 2) {
        if (size != 8) {
          OStack_90._signature._bits = 0x4000031;
          IVar13 = 0x1a7;
          goto LAB_0014003c;
        }
LAB_0013fee5:
        IVar13 = 0x1be;
      }
      else {
        if ((byte)(bVar23 - 0x2d) < 4) {
          IVar13 = kmovInstFromSize(size);
          SVar12._bits = 0x8000039;
          if (size < 5) {
            SVar12._bits = 0x4000031;
          }
          OStack_90._signature._bits = SVar12._bits;
          goto LAB_0014003c;
        }
        if (0x31 < (byte)(bVar23 - 0x33)) {
          return 3;
        }
        bVar24 = (bool)(((ArchTraits *)this)->_instHints)._data[0];
        IVar13 = 0x1be;
        if (bVar24 != false) {
          IVar13 = 0x499;
        }
        if (size != 8) {
          IVar13 = 0x1a7;
          if (bVar24 != false) {
            IVar13 = 0x483;
          }
          OStack_90._signature._bits = 0x4000031;
          goto LAB_0014003c;
        }
      }
LAB_0013feeb:
      size = 8;
      goto LAB_0014003c;
    }
    if ((bVar2 < 5) && (bVar3 < 4)) {
      OStack_90._signature._bits = 0x4000031;
      IVar13 = 0x1c9;
      size = uVar11;
      goto LAB_0014003c;
    }
    size = uVar18;
    if (uVar19 < uVar11) {
      size = (uint)bVar2;
    }
    SVar12._bits = 0x8000039;
    if (size == 4) {
      SVar12._bits = 0x4000031;
    }
    OStack_90._signature._bits = SVar12._bits;
    IVar13 = 0x1a2;
joined_r0x00140237:
    if ((uVar7._0_4_ & 7) != 1) goto LAB_0014003c;
LAB_0013ffdc:
    OStack_a0._signature._bits = SVar12._bits;
  }
  else {
    if ((byte)(bVar5 - 0x31) < 2) {
      size = (uint)bVar3;
      if ((uint)bVar2 < (uint)bVar3) {
        size = (uint)bVar2;
      }
      if ((9 < bVar9) && ((uVar7._0_4_ & 7) != 2)) {
        IVar13 = 0x1be;
        if ((1 < (byte)(bVar23 - 0x31)) && (IVar13 = 0x1ab, 0x31 < (byte)(bVar23 - 0x33))) {
          return 3;
        }
        goto LAB_0014003c;
      }
      if (size == 8) goto LAB_0013fee5;
      uVar11 = uVar7._0_4_ & 7;
      IVar13 = 0x1a7;
joined_r0x00140190:
      if (uVar11 != 1) goto LAB_0014003c;
    }
    else {
      if (3 < (byte)(bVar5 - 0x2d)) {
        if (0x31 < (byte)(bVar5 - 0x33)) {
          return 3;
        }
        OStack_90._signature._bits = 0x10000161;
        IVar13 = 0x1bf;
        size = uVar11;
        if ((uVar7._0_4_ & 0xff000fff) == 0x8000391) goto LAB_0014003c;
        if (TypeUtils::_typeData[uVar22] != '+' || TypeUtils::_typeData[uVar17] != '*') {
          if (TypeUtils::_typeData[uVar22] == '*' && TypeUtils::_typeData[uVar17] == '+') {
            uVar11 = uVar11 * 2;
            if (uVar19 <= uVar11) {
              uVar11 = (uint)bVar2;
            }
            size = uVar11 >> 1;
            bVar24 = ((((ArchTraits *)this)->_instHints)._data[0] & 1) != 0;
            IVar16 = 0x84;
            if (bVar24) {
              IVar16 = 0x375;
            }
            IVar13 = 0x7d;
            if (bVar24) {
              IVar13 = 0x35c;
            }
            if (uVar11 < 10) {
              IVar13 = IVar16;
            }
            uVar14 = 0x40000171;
            if ((uVar11 & 0xfe) < 0x21) {
              uVar14 = 0x20000169;
            }
            OStack_90._signature._bits = 0x10000161;
            if (0x10 < (uVar11 & 0xfe)) {
              OStack_90._signature._bits = uVar14;
            }
            if (0x3f < uVar11 && (uVar7._0_4_ & 7) == 1) {
              OStack_a0._baseId = uVar7._4_4_;
              OStack_a0._signature._bits = 0x20000169;
            }
            goto LAB_0014003c;
          }
          size = (uint)bVar3;
          if (uVar19 < uVar11) {
            size = (uint)bVar2;
          }
          if ((uVar7._0_4_ & 0xf07) == 1 || (uVar7._0_4_ & 7) == 2) {
            if (size < 5) {
              IVar13 = 0x1a7;
              if ((bool)(((ArchTraits *)this)->_instHints)._data[0] != false) {
                IVar13 = 0x483;
              }
              uVar11 = uVar7._0_4_ & 3;
              goto joined_r0x00140190;
            }
            if (size == 8) {
              IVar13 = 0x1be;
              if ((bool)(((ArchTraits *)this)->_instHints)._data[0] != false) {
                IVar13 = 0x499;
              }
              goto LAB_0013feeb;
            }
          }
          if ((uVar7._0_4_ & 0xf07) != 0x101 && (uVar7._0_4_ & 7) != 2) {
            return 3;
          }
          IVar13 = 0x1a5;
          if ((bool)(((ArchTraits *)this)->_instHints)._data[0] != false) {
            IVar13 = 0x482;
          }
          if ((((uVar7._0_4_ & 3) == 2) &&
              (uVar14 = Environment::stackAlignment
                                  (&(*(BaseEmitter **)&((ArchTraits *)this)->_minStackOffset)->
                                    _environment), size < uVar14)) &&
             (IVar13 = 0x1c8, (bool)(((ArchTraits *)this)->_instHints)._data[0] != false)) {
            IVar13 = 0x4a0;
          }
          uVar14 = 0x40000171;
          if (size < 0x21) {
            uVar14 = 0x20000169;
          }
          SVar12._bits = 0x10000161;
          if (0x10 < size) {
            SVar12._bits = uVar14;
          }
          OStack_90._signature._bits = SVar12._bits;
          goto joined_r0x00140237;
        }
        size = uVar18;
        if (uVar19 * 2 <= uVar11) {
          size = uVar19 * 2;
        }
        bVar24 = ((((ArchTraits *)this)->_instHints)._data[0] & 1) != 0;
        IVar16 = 0x87;
        if (bVar24) {
          IVar16 = 0x37e;
        }
        IVar13 = 0x81;
        if (bVar24) {
          IVar13 = 0x36a;
        }
        if (size < 9) {
          IVar13 = IVar16;
        }
        if ((size & 0xfe) == 0x40) {
          OStack_90._signature._bits = 0x20000169;
        }
        if ((uVar7._0_4_ & 7) != 1) goto LAB_0014003c;
        uVar14 = 0x40000171;
        if (size < 0x21) {
          uVar14 = 0x20000169;
        }
        SVar12._bits = 0x10000161;
        if (0x10 < size) {
          SVar12._bits = uVar14;
        }
        goto LAB_0013ffdc;
      }
      size = uVar18;
      if (uVar19 < uVar11) {
        size = (uint)bVar2;
      }
      if ((uVar7._0_4_ & 7) != 2 && (3 < (byte)(bVar23 - 0x2d) && 9 < bVar9)) {
        return 3;
      }
      IVar13 = kmovInstFromSize(size);
      if (4 < size || (uVar7._0_4_ & 0xf07) != 1) goto LAB_0014003c;
    }
    OStack_a0._signature._bits = 0x4000031;
  }
LAB_0014003c:
  if ((OStack_a0._signature._bits & 7) == 2) {
    BaseMem::setSize((BaseMem *)&OStack_a0,size);
  }
  pBVar4 = *(BaseEmitter **)&((ArchTraits *)this)->_minStackOffset;
  pBVar4->_inlineComment = in_R9;
  EVar10 = BaseEmitter::_emitI(pBVar4,IVar13,&OStack_90,&OStack_a0);
  return EVar10;
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitRegMove(
  const Operand_& dst_,
  const Operand_& src_, TypeId typeId, const char* comment) {

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeUtils::isValid(typeId) && !TypeUtils::isAbstract(typeId));

  Operand dst(dst_);
  Operand src(src_);

  InstId instId = Inst::kIdNone;
  uint32_t memFlags = 0;
  uint32_t overrideMemSize = 0;

  enum MemFlags : uint32_t {
    kDstMem = 0x1,
    kSrcMem = 0x2
  };

  // Detect memory operands and patch them to have the same size as the register. BaseCompiler always sets memory size
  // of allocs and spills, so it shouldn't be really necessary, however, after this function was separated from Compiler
  // it's better to make sure that the size is always specified, as we can use 'movzx' and 'movsx' that rely on it.
  if (dst.isMem()) { memFlags |= kDstMem; dst.as<Mem>().setSize(src.size()); }
  if (src.isMem()) { memFlags |= kSrcMem; src.as<Mem>().setSize(dst.size()); }

  switch (typeId) {
    case TypeId::kInt8:
    case TypeId::kUInt8:
    case TypeId::kInt16:
    case TypeId::kUInt16:
      // Special case - 'movzx' load.
      if (memFlags & kSrcMem) {
        instId = Inst::kIdMovzx;
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        break;
      }

      if (!memFlags) {
        // Change both destination and source registers to GPD (safer, no dependencies).
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        src.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kInt32:
    case TypeId::kUInt32:
    case TypeId::kInt64:
    case TypeId::kUInt64:
      instId = Inst::kIdMov;
      break;

    case TypeId::kMmx32:
      instId = Inst::kIdMovd;
      if (memFlags) break;
      ASMJIT_FALLTHROUGH;

    case TypeId::kMmx64 : instId = Inst::kIdMovq ; break;
    case TypeId::kMask8 : instId = Inst::kIdKmovb; break;
    case TypeId::kMask16: instId = Inst::kIdKmovw; break;
    case TypeId::kMask32: instId = Inst::kIdKmovd; break;
    case TypeId::kMask64: instId = Inst::kIdKmovq; break;

    default: {
      TypeId scalarTypeId = TypeUtils::scalarOf(typeId);
      if (TypeUtils::isVec32(typeId) && memFlags) {
        overrideMemSize = 4;
        if (scalarTypeId == TypeId::kFloat32)
          instId = _avxEnabled ? Inst::kIdVmovss : Inst::kIdMovss;
        else
          instId = _avxEnabled ? Inst::kIdVmovd : Inst::kIdMovd;
        break;
      }

      if (TypeUtils::isVec64(typeId) && memFlags) {
        overrideMemSize = 8;
        if (scalarTypeId == TypeId::kFloat64)
          instId = _avxEnabled ? Inst::kIdVmovsd : Inst::kIdMovsd;
        else
          instId = _avxEnabled ? Inst::kIdVmovq : Inst::kIdMovq;
        break;
      }

      if (scalarTypeId == TypeId::kFloat32)
        instId = _avxEnabled ? Inst::kIdVmovaps : Inst::kIdMovaps;
      else if (scalarTypeId == TypeId::kFloat64)
        instId = _avxEnabled ? Inst::kIdVmovapd : Inst::kIdMovapd;
      else if (!_avx512Enabled)
        instId = _avxEnabled ? Inst::kIdVmovdqa : Inst::kIdMovdqa;
      else
        instId = Inst::kIdVmovdqa32;
      break;
    }
  }

  if (!instId)
    return DebugUtils::errored(kErrorInvalidState);

  if (overrideMemSize) {
    if (dst.isMem()) dst.as<Mem>().setSize(overrideMemSize);
    if (src.isMem()) src.as<Mem>().setSize(overrideMemSize);
  }

  _emitter->setInlineComment(comment);
  return _emitter->emit(instId, dst, src);
}